

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepTiledOutputFile::copyPixels(DeepTiledOutputFile *this,DeepTiledInputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  Data *pDVar3;
  pthread_mutex_t *__mutex;
  bool bVar4;
  Header *this_00;
  TileDescription *pTVar5;
  TileDescription *pTVar6;
  Box2i *pBVar7;
  Box2i *pBVar8;
  LineOrder *pLVar9;
  Compression *pCVar10;
  ChannelList *this_01;
  ChannelList *other;
  size_t sVar11;
  char *pcVar12;
  ArgExc *pAVar13;
  ostream *poVar14;
  LogicExc *this_02;
  LevelRoundingMode LVar15;
  size_type sVar16;
  ulong uVar17;
  value_type_conflict *__val;
  char *pcVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  TileCoord TVar23;
  int dx;
  int ly;
  int lx;
  int dy;
  uint64_t dataSize;
  vector<int,_std::allocator<int>_> ly_list;
  vector<int,_std::allocator<int>_> lx_list;
  vector<int,_std::allocator<int>_> dy_list;
  vector<int,_std::allocator<int>_> dx_list;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  vector<char,_std::allocator<char>_> local_228;
  ulong local_210;
  vector<int,_std::allocator<int>_> local_208;
  vector<int,_std::allocator<int>_> local_1f0;
  vector<int,_std::allocator<int>_> local_1d8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  
  pDVar3 = this->_data;
  this_00 = DeepTiledInputFile::header(in);
  pTVar5 = Header::tileDescription(&pDVar3->header);
  pTVar6 = Header::tileDescription(this_00);
  if ((((pTVar5->xSize != pTVar6->xSize) || (pTVar5->ySize != pTVar6->ySize)) ||
      (pTVar5->mode != pTVar6->mode)) ||
     (LVar15 = pTVar5->roundingMode, LVar15 != pTVar6->roundingMode)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar12 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar12 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" failed. The files have different tile descriptions.",0x35);
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pBVar7 = Header::dataWindow(&pDVar3->header);
  pBVar8 = Header::dataWindow(this_00);
  iVar21 = -(uint)((pBVar8->min).x == (pBVar7->min).x);
  iVar22 = -(uint)((pBVar8->min).y == (pBVar7->min).y);
  auVar19._4_4_ = iVar21;
  auVar19._0_4_ = iVar21;
  auVar19._8_4_ = iVar22;
  auVar19._12_4_ = iVar22;
  iVar21 = movmskpd(LVar15,auVar19);
  if ((iVar21 != 3) ||
     (iVar21 = -(uint)((pBVar8->max).x == (pBVar7->max).x),
     iVar22 = -(uint)((pBVar8->max).y == (pBVar7->max).y), auVar20._4_4_ = iVar21,
     auVar20._0_4_ = iVar21, auVar20._8_4_ = iVar22, auVar20._12_4_ = iVar22,
     iVar21 = movmskpd((int)pBVar8,auVar20), iVar21 != 3)) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Cannot copy pixels from image file \"",0x24);
    pcVar12 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar12 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\". The files have different data windows.",0x29);
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pLVar9 = Header::lineOrder(&pDVar3->header);
  LVar1 = *pLVar9;
  pLVar9 = Header::lineOrder(this_00);
  if (LVar1 != *pLVar9) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar12 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar12 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" failed. The files have different line orders.",0x2f);
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  pCVar10 = Header::compression(&pDVar3->header);
  CVar2 = *pCVar10;
  pCVar10 = Header::compression(this_00);
  if (CVar2 != *pCVar10) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar12 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar12 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" failed. The files use different compression methods.",0x36);
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  this_01 = Header::channels(&pDVar3->header);
  other = Header::channels(this_00);
  bVar4 = ChannelList::operator==(this_01,other);
  if (!bVar4) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar12 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar12 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" failed.  The files have different channel lists.",0x32);
    pAVar13 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar13,(stringstream *)local_1b8);
    __cxa_throw(pAVar13,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  bVar4 = TileOffsets::isEmpty(&this->_data->tileOffsets);
  if (!bVar4) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Quick pixel copy from image file \"",0x22);
    pcVar12 = DeepTiledInputFile::fileName(in);
    poVar14 = std::operator<<((ostream *)&local_1a8,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" to image file \"",0x11);
    pcVar12 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" failed. \"",0xb);
    pcVar12 = OStream::fileName(this->_data->_streamData->os);
    poVar14 = std::operator<<(poVar14,pcVar12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"\" already contains pixel data.",0x1e);
    this_02 = (LogicExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::LogicExc::LogicExc(this_02,(stringstream *)local_1b8);
    __cxa_throw(this_02,&Iex_3_2::LogicExc::typeinfo,Iex_3_2::LogicExc::~LogicExc);
  }
  sVar11 = DeepTiledInputFile::totalTiles(in);
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar21 = pthread_mutex_lock(__mutex);
  if (iVar21 != 0) {
    std::__throw_system_error(iVar21);
  }
  sVar16 = 1;
  if (this->_data->lineOrder == RANDOM_Y) {
    sVar16 = sVar11;
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1b8,sVar16,(allocator_type *)&local_1d8);
  sVar16 = 1;
  if (this->_data->lineOrder == RANDOM_Y) {
    sVar16 = sVar11;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_1d8,sVar16,(allocator_type *)&local_1f0);
  sVar16 = 1;
  if (this->_data->lineOrder == RANDOM_Y) {
    sVar16 = sVar11;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_1f0,sVar16,(allocator_type *)&local_208);
  sVar16 = 1;
  if (this->_data->lineOrder == RANDOM_Y) {
    sVar16 = sVar11;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_208,sVar16,(allocator_type *)&local_228);
  if (this->_data->lineOrder == RANDOM_Y) {
    DeepTiledInputFile::getTileOrder
              (in,(int *)local_1b8._0_8_,
               local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    pDVar3 = this->_data;
    (pDVar3->nextTileToWrite).dx = *(int *)local_1b8._0_8_;
    (pDVar3->nextTileToWrite).dy =
         *local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (pDVar3->nextTileToWrite).lx =
         *local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    (pDVar3->nextTileToWrite).ly =
         *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
  }
  pcVar12 = (char *)operator_new(0x1000);
  pcVar18 = pcVar12 + 0x1000;
  local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = pcVar12;
  local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar18;
  memset(pcVar12,0,0x1000);
  local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar18;
  if (sVar11 != 0) {
    local_1c0 = sVar11 - 1;
    uVar17 = 0;
    do {
      pDVar3 = this->_data;
      local_238 = (pDVar3->nextTileToWrite).dx;
      local_22c = (pDVar3->nextTileToWrite).dy;
      local_230 = (pDVar3->nextTileToWrite).lx;
      local_234 = (pDVar3->nextTileToWrite).ly;
      local_210 = (long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
      DeepTiledInputFile::rawTileData
                (in,&local_238,&local_22c,&local_230,&local_234,
                 local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,&local_210);
      if ((ulong)((long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) < local_210) {
        std::vector<char,_std::allocator<char>_>::resize(&local_228,local_210);
        DeepTiledInputFile::rawTileData
                  (in,&local_238,&local_22c,&local_230,&local_234,
                   local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_210);
      }
      anon_unknown_8::writeTileData
                (this->_data,local_238,local_22c,local_230,local_234,
                 local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start +
                 *(uint64_t *)
                  (local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x10) + 0x28,
                 *(uint64_t *)
                  (local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x18),
                 *(uint64_t *)
                  (local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x20),
                 local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x28,
                 *(uint64_t *)
                  (local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + 0x10));
      pDVar3 = this->_data;
      if (pDVar3->lineOrder == RANDOM_Y) {
        if (uVar17 < local_1c0) {
          (pDVar3->nextTileToWrite).dx = *(int *)(local_1b8._0_8_ + (uVar17 + 1) * 4);
          (pDVar3->nextTileToWrite).dy =
               local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17 + 1];
          (pDVar3->nextTileToWrite).lx =
               local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17 + 1];
          (pDVar3->nextTileToWrite).ly =
               local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17 + 1];
        }
      }
      else {
        TVar23 = Data::nextTileCoord(pDVar3,*(TileCoord **)&pDVar3->nextTileToWrite);
        this->_data->nextTileToWrite = TVar23;
      }
      uVar17 = uVar17 + 1;
    } while (sVar11 != uVar17);
    pcVar12 = local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start == (char *)0x0) goto LAB_0016fb3c;
  }
  operator_delete(pcVar12,(long)local_228.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - (long)pcVar12);
LAB_0016fb3c:
  if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((int *)local_1b8._0_8_ != (int *)0x0) {
    operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledOutputFile::copyPixels (DeepTiledInputFile& in)
{

    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!(hdr.tileDescription () == inHdr.tileDescription ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different tile descriptions.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". The "
                   "files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" "
                   "failed.  The files have different channel "
                   "lists.");

    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty ())
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << _data->_streamData->os->fileName ()
                << "\" "
                   "failed. \""
                << fileName ()
                << "\" "
                   "already contains pixel data.");

    size_t numAllTiles = in.totalTiles ();

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // special handling for random tiles
    //

    vector<int> dx_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> dy_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> lx_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);
    vector<int> ly_list (_data->lineOrder == RANDOM_Y ? numAllTiles : 1);

    if (_data->lineOrder == RANDOM_Y)
    {
        in.getTileOrder (&dx_list[0], &dy_list[0], &lx_list[0], &ly_list[0]);
        _data->nextTileToWrite.dx = dx_list[0];
        _data->nextTileToWrite.dy = dy_list[0];
        _data->nextTileToWrite.lx = lx_list[0];
        _data->nextTileToWrite.ly = ly_list[0];
    }

    vector<char> data (4096);
    for (size_t i = 0; i < numAllTiles; ++i)
    {

        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        uint64_t dataSize = data.size ();

        in.rawTileData (dx, dy, lx, ly, &data[0], dataSize);
        if (dataSize > data.size ())
        {
            data.resize (dataSize);
            in.rawTileData (dx, dy, lx, ly, &data[0], dataSize);
        }
        uint64_t sampleCountTableSize  = *(uint64_t*) (&data[0] + 16);
        uint64_t pixelDataSize         = *(uint64_t*) (&data[0] + 24);
        uint64_t unpackedPixelDataSize = *(uint64_t*) (&data[0] + 32);
        char*    sampleCountTable      = &data[0] + 40;
        char*    pixelData = sampleCountTable + sampleCountTableSize;

        writeTileData (
            _data,
            dx,
            dy,
            lx,
            ly,
            pixelData,
            pixelDataSize,
            unpackedPixelDataSize,
            sampleCountTable,
            sampleCountTableSize);

        if (_data->lineOrder == RANDOM_Y)
        {
            if (i < numAllTiles - 1)
            {
                _data->nextTileToWrite.dx = dx_list[i + 1];
                _data->nextTileToWrite.dy = dy_list[i + 1];
                _data->nextTileToWrite.lx = lx_list[i + 1];
                _data->nextTileToWrite.ly = ly_list[i + 1];
            }
        }
        else
        {
            _data->nextTileToWrite =
                _data->nextTileCoord (_data->nextTileToWrite);
        }
    }
}